

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex_wrapper_linux.hpp
# Opt level: O3

void Fossilize::futex_wrapper_lock(int *lock)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  
  uVar2 = 0;
  LOCK();
  bVar3 = *lock == 0;
  if (bVar3) {
    *lock = 1;
  }
  else {
    uVar2 = (ulong)(uint)*lock;
  }
  UNLOCK();
  uVar4 = uVar2;
  do {
    if (bVar3) {
      return;
    }
    if ((int)uVar2 == 2) {
LAB_00133b39:
      uVar4 = uVar4 & 0xffffffff00000000;
      syscall(0xca,lock,0,2,0,0,uVar4);
    }
    else {
      LOCK();
      iVar1 = *lock;
      if (iVar1 == 1) {
        *lock = 2;
        iVar1 = 1;
      }
      UNLOCK();
      if (iVar1 != 0) goto LAB_00133b39;
    }
    uVar2 = 0;
    LOCK();
    bVar3 = *lock == 0;
    if (bVar3) {
      *lock = 2;
    }
    else {
      uVar2 = (ulong)(uint)*lock;
    }
    UNLOCK();
  } while( true );
}

Assistant:

static inline void futex_wrapper_lock(int *lock)
{
	int c = cmpxchg(lock, 0, 1);
	if (c != 0)
	{
		// Contention.
		do
		{
			// Need to lock. Force *lock to be 2.
			if (c == 2 || cmpxchg(lock, 1, 2) != 0)
			{
				// If *lock is 2 (was not unlocked somehow by other thread),
				// wait until it's woken up.
				syscall(SYS_futex, lock, FUTEX_WAIT, 2, 0, 0, 0);
			}
		} while ((c = cmpxchg(lock, 0, 2)) != 0);
	}
}